

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  parasail_result_t *ppVar16;
  longlong lVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  char cVar20;
  char cVar21;
  int iVar22;
  int iVar23;
  __m128i *ptr;
  int8_t *ptr_00;
  uint uVar24;
  ulong extraout_RDX;
  ulong uVar25;
  ulong extraout_RDX_01;
  int32_t in_R9D;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  parasail_result_t *extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  parasail_result_t *extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  undefined1 auVar26 [16];
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i alVar27;
  __m128i alVar28;
  __m128i alVar29;
  __m128i alVar30;
  __m128i vH_00;
  long in_stack_fffffffffffffb58;
  long local_498;
  long local_490;
  __m128i vH_1;
  int8_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_38b;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_318;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  longlong extraout_RDX_00;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse2_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse2_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse2_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse2_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse2_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse2_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse2_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse2_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_318 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar22 = (iVar1 + 0xf) / 0x10;
    pvVar3 = (profile->profile8).score;
    i._0_1_ = (char)open;
    uVar12 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  CONCAT12((char)i,CONCAT11((char)i,(char)i)))))));
    uVar13 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  CONCAT12((char)i,CONCAT11((char)i,(char)i)))))));
    j._0_1_ = (undefined1)gap;
    uVar14 = CONCAT17((undefined1)j,
                      CONCAT16((undefined1)j,
                               CONCAT15((undefined1)j,
                                        CONCAT14((undefined1)j,
                                                 CONCAT13((undefined1)j,
                                                          CONCAT12((undefined1)j,
                                                                   CONCAT11((undefined1)j,
                                                                            (undefined1)j)))))));
    uVar15 = CONCAT17((undefined1)j,
                      CONCAT16((undefined1)j,
                               CONCAT15((undefined1)j,
                                        CONCAT14((undefined1)j,
                                                 CONCAT13((undefined1)j,
                                                          CONCAT12((undefined1)j,
                                                                   CONCAT11((undefined1)j,
                                                                            (undefined1)j)))))));
    if (ppVar2->min <= -open) {
      i._0_1_ = -(char)ppVar2->min;
    }
    cVar20 = (char)i + -0x7f;
    cVar21 = ((byte)ppVar2->max ^ 0x7f) - 1;
    ppVar16 = (parasail_result_t *)
              CONCAT17(cVar20,CONCAT16(cVar20,CONCAT15(cVar20,CONCAT14(cVar20,CONCAT13(cVar20,
                                                  CONCAT12(cVar20,CONCAT11(cVar20,cVar20)))))));
    lVar17 = CONCAT17(cVar20,CONCAT16(cVar20,CONCAT15(cVar20,CONCAT14(cVar20,CONCAT13(cVar20,
                                                  CONCAT12(cVar20,CONCAT11(cVar20,cVar20)))))));
    vSaturationCheckMax[1] =
         CONCAT17(cVar21,CONCAT16(cVar21,CONCAT15(cVar21,CONCAT14(cVar21,CONCAT13(cVar21,CONCAT12(
                                                  cVar21,CONCAT11(cVar21,cVar21)))))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar21,CONCAT16(cVar21,CONCAT15(cVar21,CONCAT14(cVar21,CONCAT13(cVar21,CONCAT12(
                                                  cVar21,CONCAT11(cVar21,cVar21)))))));
    result = ppVar16;
    vSaturationCheckMax[0] = lVar17;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar22 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100801;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar22);
      pvE = parasail_memalign___m128i(0x10,(long)iVar22);
      ptr = parasail_memalign___m128i(0x10,(long)iVar22);
      alVar29[0] = (size_t)(s2Len + 1);
      ptr_00 = parasail_memalign_int8_t(0x10,alVar29[0]);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        uVar25 = extraout_RDX;
        for (k = 0; k < iVar22; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            uVar24 = h.m[1]._0_4_ * iVar22 + k;
            uVar25 = (ulong)uVar24;
            local_498 = (long)(int)(-(gap * uVar24) - open);
            local_490 = local_498;
            if (local_498 < -0x80) {
              local_490 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_490;
            local_498 = local_498 - open;
            if (local_498 < -0x80) {
              local_498 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_498;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar23 = -(gap * (k + -1)) - open;
          if (iVar23 < -0x80) {
            iVar23 = -0x80;
          }
          uVar25 = (ulong)CONCAT31((int3)((uint)(k + -1) >> 8),(int8_t)iVar23);
          ptr_00[k] = (int8_t)iVar23;
        }
        for (s1Len = 0; palVar19 = pvHLoad, palVar18 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar17;
          vH[1] = (longlong)ppVar16;
          iVar23 = ppVar2->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar18;
          alVar29[0] = 0;
          alVar30[0] = (int *)(ulong)(uint)(int)ptr_00[s1Len];
          alVar30[1] = 0;
          alVar27 = _mm_insert_epi8_rpl(alVar30,s2[s1Len],s1Len);
          uVar25 = alVar27[1];
          vH[0] = extraout_XMM0_Qb;
          vP = (__m128i *)extraout_XMM0_Qa;
          for (k = 0; k < iVar22; k = k + 1) {
            paddsb((undefined1  [16])_vP,
                   *(undefined1 (*) [16])
                    ((long)pvVar3 + (long)k * 0x10 + (long)(iVar23 * iVar22) * 0x10));
            b[1] = (long)k * 0x10;
            alVar27 = ptr[k];
            alVar28[1] = alVar29[0];
            alVar28[0] = (longlong)alVar30[0];
            b[0] = uVar25;
            alVar28 = _mm_max_epi8_rpl(alVar28,b);
            b_00[0] = alVar28[1];
            a[1] = alVar29[0];
            a[0] = (longlong)alVar30[0];
            b_00[1] = b[1];
            alVar28 = _mm_max_epi8_rpl(a,b_00);
            b_01[0] = alVar28[1];
            b_01[1] = (long)k * 0x10;
            palVar18[k][0] = extraout_XMM0_Qa_00;
            palVar18[k][1] = extraout_XMM0_Qb_00;
            a_00[1] = alVar29[0];
            a_00[0] = (longlong)alVar30[0];
            alVar28 = _mm_max_epi8_rpl(a_00,b_01);
            b_02[0] = alVar28[1];
            a_01[1] = alVar29[0];
            a_01[0] = (longlong)alVar30[0];
            b_02[1] = b_01[1];
            result = extraout_XMM0_Qa_01;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_01;
            alVar28 = _mm_min_epi8_rpl(a_01,b_02);
            b_03[0] = alVar28[1];
            a_02[1] = alVar29[0];
            a_02[0] = (longlong)alVar30[0];
            b_03[1] = b_01[1];
            alVar28 = _mm_min_epi8_rpl(a_02,b_03);
            b_04[0] = alVar28[1];
            a_03[1] = alVar29[0];
            a_03[0] = (longlong)alVar30[0];
            b_04[1] = b_01[1];
            _mm_min_epi8_rpl(a_03,b_04);
            alVar30[0] = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                         rowcols->score_row;
            vH_00[0] = (size_t)(uint)k;
            uVar25 = (ulong)(uint)s1Len;
            vH_00[1]._0_4_ = iVar22;
            vH_00[1]._4_4_ = 0;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_02;
            arr_store_si128(alVar30[0],vH_00,s1Len,s2Len,in_R9D,(int32_t)in_stack_fffffffffffffb58);
            auVar9._8_8_ = extraout_XMM0_Qb_00;
            auVar9._0_8_ = extraout_XMM0_Qa_00;
            auVar8._8_8_ = uVar13;
            auVar8._0_8_ = uVar12;
            psubsb(auVar9,auVar8);
            auVar7._8_8_ = uVar15;
            auVar7._0_8_ = uVar14;
            psubsb((undefined1  [16])alVar27,auVar7);
            alVar27[1] = vH_00[0];
            alVar27[0] = (longlong)alVar30[0];
            b_05[1] = uVar25;
            b_05[0] = extraout_RDX_00;
            alVar29 = _mm_max_epi8_rpl(alVar27,b_05);
            b_06[0] = alVar29[1];
            b_06[1] = (long)k * 0x10;
            ptr[k][0] = extraout_XMM0_Qa_03;
            ptr[k][1] = extraout_XMM0_Qb_03;
            auVar26._8_8_ = uVar15;
            auVar26._0_8_ = uVar14;
            psubsb(stack0xfffffffffffffbc8,auVar26);
            a_04[1] = vH_00[0];
            a_04[0] = (longlong)alVar30[0];
            alVar29 = _mm_max_epi8_rpl(a_04,b_06);
            uVar25 = alVar29[1];
            vF[0] = extraout_XMM0_Qb_04;
            vH[1] = extraout_XMM0_Qa_04;
            _vP = palVar19[k];
            alVar29[0] = vH_00[0];
            vSaturationCheckMin[0] = extraout_XMM0_Qb_02;
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            in_stack_fffffffffffffb58 = (long)(ptr_00[s1Len + 1] - open);
            if (in_stack_fffffffffffffb58 < -0x80) {
              in_stack_fffffffffffffb58 = -0x80;
            }
            alVar29[0] = 0;
            a_05[0] = (int *)(ulong)(uint)(int)(char)in_stack_fffffffffffffb58;
            a_05[1] = 0;
            alVar30 = _mm_insert_epi8_rpl(a_05,(int8_t)uVar25,s1Len + 1);
            uVar25 = alVar30[1];
            vF[0] = extraout_XMM0_Qb_05;
            vH[1] = extraout_XMM0_Qa_05;
            for (k = 0; k < iVar22; k = k + 1) {
              b_07[1] = (long)k * 0x10;
              a_06[1] = alVar29[0];
              a_06[0] = (longlong)a_05[0];
              b_07[0] = uVar25;
              alVar30 = _mm_max_epi8_rpl(a_06,b_07);
              b_08[0] = alVar30[1];
              b_08[1] = (long)k * 0x10;
              palVar18[k][0] = extraout_XMM0_Qa_06;
              palVar18[k][1] = extraout_XMM0_Qb_06;
              a_07[1] = alVar29[0];
              a_07[0] = (longlong)a_05[0];
              alVar30 = _mm_min_epi8_rpl(a_07,b_08);
              b_09[0] = alVar30[1];
              a_08[1] = alVar29[0];
              a_08[0] = (longlong)a_05[0];
              b_09[1] = b_08[1];
              vSaturationCheckMax[1] = extraout_XMM0_Qa_07;
              _mm_max_epi8_rpl(a_08,b_09);
              a_05[0] = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols
                        ->score_row;
              alVar29[0] = (size_t)(uint)k;
              alVar29[1]._0_4_ = iVar22;
              alVar29[1]._4_4_ = 0;
              result = extraout_XMM0_Qa_08;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_08;
              arr_store_si128(a_05[0],alVar29,s1Len,s2Len,in_R9D,(int32_t)in_stack_fffffffffffffb58)
              ;
              auVar6._8_8_ = extraout_XMM0_Qb_06;
              auVar6._0_8_ = extraout_XMM0_Qa_06;
              auVar5._8_8_ = uVar13;
              auVar5._0_8_ = uVar12;
              auVar26 = psubsb(auVar6,auVar5);
              auVar4._8_8_ = uVar15;
              auVar4._0_8_ = uVar14;
              register0x00001200 = psubsb(stack0xfffffffffffffbc8,auVar4);
              local_f8 = (char)vH[1];
              cStack_f7 = vH[1]._1_1_;
              cStack_f6 = vH[1]._2_1_;
              cStack_f5 = vH[1]._3_1_;
              cStack_f4 = vH[1]._4_1_;
              cStack_f3 = vH[1]._5_1_;
              cStack_f2 = vH[1]._6_1_;
              cStack_f1 = vH[1]._7_1_;
              cStack_f0 = (char)vH[2];
              cStack_ef = vH[2]._1_1_;
              cStack_ee = vH[2]._2_1_;
              cStack_ed = vH[2]._3_1_;
              cStack_ec = vH[2]._4_1_;
              cStack_eb = vH[2]._5_1_;
              cStack_ea = vH[2]._6_1_;
              cStack_e9 = vH[2]._7_1_;
              local_108 = auVar26[0];
              cStack_107 = auVar26[1];
              cStack_106 = auVar26[2];
              cStack_105 = auVar26[3];
              cStack_104 = auVar26[4];
              cStack_103 = auVar26[5];
              cStack_102 = auVar26[6];
              cStack_101 = auVar26[7];
              cStack_100 = auVar26[8];
              cStack_ff = auVar26[9];
              cStack_fe = auVar26[10];
              cStack_fd = auVar26[0xb];
              cStack_fc = auVar26[0xc];
              cStack_fb = auVar26[0xd];
              cStack_fa = auVar26[0xe];
              cStack_f9 = auVar26[0xf];
              auVar11[1] = -(cStack_107 < cStack_f7);
              auVar11[0] = -(local_108 < local_f8);
              auVar11[2] = -(cStack_106 < cStack_f6);
              auVar11[3] = -(cStack_105 < cStack_f5);
              auVar11[4] = -(cStack_104 < cStack_f4);
              auVar11[5] = -(cStack_103 < cStack_f3);
              auVar11[6] = -(cStack_102 < cStack_f2);
              auVar11[7] = -(cStack_101 < cStack_f1);
              auVar11[8] = -(cStack_100 < cStack_f0);
              auVar11[9] = -(cStack_ff < cStack_ef);
              auVar11[10] = -(cStack_fe < cStack_ee);
              auVar11[0xb] = -(cStack_fd < cStack_ed);
              auVar11[0xc] = -(cStack_fc < cStack_ec);
              auVar11[0xd] = -(cStack_fb < cStack_eb);
              auVar11[0xe] = -(cStack_fa < cStack_ea);
              auVar11[0xf] = -(cStack_f9 < cStack_e9);
              uVar25 = extraout_RDX_01;
              vSaturationCheckMin[0] = extraout_XMM0_Qb_07;
              if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar11 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar11 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar11 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar11 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar11 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar11 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar11 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar11 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  cStack_f9 >= cStack_e9) goto LAB_006c0599;
            }
          }
LAB_006c0599:
        }
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar22) + 0x10U);
            end_query = end_query + 1) {
        }
        a_09[1] = alVar29[0];
        a_09[0] = 0xf;
        local_38b = _mm_extract_epi8_rpl(a_09,(int)uVar25);
        local_a8 = (char)vSaturationCheckMax[1];
        cStack_a7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_a6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_a5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_a4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_a3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_a2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_a1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_a0 = (char)vSaturationCheckMin[0];
        cStack_9f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_9e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_9d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_9c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_9b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_9a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_99 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_118 = (char)result;
        cStack_117 = (char)((ulong)result >> 8);
        cStack_116 = (char)((ulong)result >> 0x10);
        cStack_115 = (char)((ulong)result >> 0x18);
        cStack_114 = (char)((ulong)result >> 0x20);
        cStack_113 = (char)((ulong)result >> 0x28);
        cStack_112 = (char)((ulong)result >> 0x30);
        cStack_111 = (char)((ulong)result >> 0x38);
        cStack_110 = (char)vSaturationCheckMax[0];
        cStack_10f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_10e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_10d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_10c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_10b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_10a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_109 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar25 = CONCAT17(-(cStack_99 < cVar20),
                          CONCAT16(-(cStack_9a < cVar20),
                                   CONCAT15(-(cStack_9b < cVar20),
                                            CONCAT14(-(cStack_9c < cVar20),
                                                     CONCAT13(-(cStack_9d < cVar20),
                                                              CONCAT12(-(cStack_9e < cVar20),
                                                                       CONCAT11(-(cStack_9f < cVar20
                                                                                 ),-(cStack_a0 <
                                                                                    cVar20)))))))) |
                 CONCAT17(-(cVar21 < cStack_109),
                          CONCAT16(-(cVar21 < cStack_10a),
                                   CONCAT15(-(cVar21 < cStack_10b),
                                            CONCAT14(-(cVar21 < cStack_10c),
                                                     CONCAT13(-(cVar21 < cStack_10d),
                                                              CONCAT12(-(cVar21 < cStack_10e),
                                                                       CONCAT11(-(cVar21 < 
                                                  cStack_10f),-(cVar21 < cStack_110))))))));
        auVar10._8_8_ = uVar25;
        auVar10._0_8_ =
             CONCAT17(-(cStack_a1 < cVar20),
                      CONCAT16(-(cStack_a2 < cVar20),
                               CONCAT15(-(cStack_a3 < cVar20),
                                        CONCAT14(-(cStack_a4 < cVar20),
                                                 CONCAT13(-(cStack_a5 < cVar20),
                                                          CONCAT12(-(cStack_a6 < cVar20),
                                                                   CONCAT11(-(cStack_a7 < cVar20),
                                                                            -(local_a8 < cVar20)))))
                                       ))) |
             CONCAT17(-(cVar21 < cStack_111),
                      CONCAT16(-(cVar21 < cStack_112),
                               CONCAT15(-(cVar21 < cStack_113),
                                        CONCAT14(-(cVar21 < cStack_114),
                                                 CONCAT13(-(cVar21 < cStack_115),
                                                          CONCAT12(-(cVar21 < cStack_116),
                                                                   CONCAT11(-(cVar21 < cStack_117),
                                                                            -(cVar21 < local_118))))
                                                ))));
        if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar25 >> 7 & 1) != 0) || (uVar25 >> 0xf & 1) != 0) || (uVar25 >> 0x17 & 1) != 0)
               || (uVar25 >> 0x1f & 1) != 0) || (uVar25 >> 0x27 & 1) != 0) ||
             (uVar25 >> 0x2f & 1) != 0) || (uVar25 >> 0x37 & 1) != 0) || (long)uVar25 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_38b = '\0';
          local_318 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_38b;
        *(int *)((long)&_segNum->s1 + 4) = local_318;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}